

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall PowerPos<0,_0,_0>::propagate_y(PowerPos<0,_0,_0> *this)

{
  int iVar1;
  uint uVar2;
  int64_t iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int64_t m_v;
  long lVar7;
  IntVar *pIVar8;
  IntVar *pIVar9;
  double dVar10;
  double dVar11;
  
  iVar1 = (((this->z).var)->min).v;
  if ((0 < iVar1) && (1 < (((this->x).var)->max).v)) {
    dVar10 = log2((double)iVar1);
    dVar11 = log2((double)(((this->x).var)->max).v);
    dVar10 = ceil(dVar10 / dVar11);
    lVar6 = (long)dVar10;
    pIVar8 = (this->y).var;
    lVar5 = (long)(pIVar8->min).v;
    if (lVar5 < lVar6) {
      pIVar9 = (this->z).var;
      iVar1 = (pIVar9->min).v;
      iVar3 = my_pow((long)(((this->x).var)->max).v,lVar6 + -1);
      lVar7 = lVar6 + -1;
      if (iVar3 < iVar1) {
        lVar7 = lVar6;
      }
      if (lVar5 < lVar7) {
        if (so.lazy == true) {
          iVar1 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])();
          uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          uVar4 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
          pIVar8 = (this->y).var;
        }
        else {
          uVar4 = 0;
        }
        iVar1 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])(pIVar8,lVar7,uVar4,1);
        if ((char)iVar1 == '\0') {
          return false;
        }
      }
    }
  }
  if ((((this->x).var)->min).v < 2) {
    return true;
  }
  dVar10 = log2((double)(((this->z).var)->max).v);
  dVar11 = log2((double)(((this->x).var)->min).v);
  dVar10 = floor(dVar10 / dVar11);
  lVar5 = (long)dVar10;
  if (lVar5 < (((this->y).var)->max).v) {
    pIVar9 = (this->x).var;
    pIVar8 = (this->z).var;
    iVar1 = (pIVar8->max).v;
    iVar3 = my_pow((long)(pIVar9->min).v,lVar5 + 1);
    lVar6 = lVar5 + 1;
    if (iVar3 < iVar1) {
      lVar6 = lVar5;
    }
    if (lVar6 < (pIVar9->max).v) {
      if (so.lazy == true) {
        iVar1 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])();
        uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar4 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
        pIVar9 = (this->x).var;
      }
      else {
        uVar4 = 0;
      }
      iVar1 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])(pIVar9,lVar6,uVar4,1);
      if ((char)iVar1 == '\0') {
        return false;
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_y() {
		double log_res;
		// Propagation on the lower bound
		if (z.getMin() > 0 && x.getMax() > 1) {
			log_res = log2(z.getMin()) / log2(x.getMax());
			int64_t y_min_new = static_cast<int64_t>(ceil(log_res));
			if (y_min_new > y.getMin()) {
				// Check for numerical errors and correct them
				if (z.getMin() <= my_pow(x.getMax(), y_min_new - 1)) {
					y_min_new--;
				}
				setDom(y, setMin, y_min_new, z.getMinLit(), x.getMaxLit());
			}
		}
		// Propagation on the upper bound
		if (x.getMin() > 1) {
			log_res = log2(z.getMax()) / log2(x.getMin());
			int64_t y_max_new = static_cast<int64_t>(floor(log_res));
			if (y_max_new < y.getMax()) {
				// Check for numerical errors and correct them
				if (z.getMax() <= my_pow(x.getMin(), y_max_new + 1)) {
					y_max_new++;
				}
				setDom(x, setMax, y_max_new, z.getMaxLit(), x.getMinLit());
			}
		}
		return true;
	}